

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxalloc.h
# Opt level: O0

void soplex::
     spx_realloc<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::RangeType*>
               (RangeType **p,int n)

{
  ostream *poVar1;
  SPxMemoryException *this;
  uint in_ESI;
  undefined8 *in_RDI;
  RangeType *pp;
  string *in_stack_ffffffffffffff98;
  allocator local_39;
  string local_38 [32];
  void *local_18;
  uint local_c;
  undefined8 *local_8;
  
  local_c = in_ESI;
  if (in_ESI == 0) {
    local_c = 1;
  }
  local_8 = in_RDI;
  local_18 = realloc((void *)*in_RDI,(ulong)local_c << 2);
  if (local_18 == (void *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "EMALLC02 realloc: Out of memory - cannot allocate ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)local_c << 2);
    poVar1 = std::operator<<(poVar1," bytes");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this = (SPxMemoryException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"XMALLC02 realloc: Could not allocate enough memory",&local_39);
    SPxMemoryException::SPxMemoryException(this,in_stack_ffffffffffffff98);
    __cxa_throw(this,&SPxMemoryException::typeinfo,SPxMemoryException::~SPxMemoryException);
  }
  *local_8 = local_18;
  return;
}

Assistant:

inline void spx_realloc(T& p, int n)
{
   assert(n >= 0);

   /* new pointer to not lose old one in case of problems */
   T pp;

   if(n == 0)
      n = 1;

   try
   {
      pp = reinterpret_cast<T>(realloc(p, sizeof(*p) * (unsigned int) n));
   }
   catch(const std::bad_alloc&)
   {
      throw(SPxMemoryException("Error reallocating memory"));
   }

   if(nullptr == pp)
   {
      std::cerr << "EMALLC02 realloc: Out of memory - cannot allocate "
                << sizeof(*p) * (unsigned int) n << " bytes" << std::endl;
      throw(SPxMemoryException("XMALLC02 realloc: Could not allocate enough memory"));
   }

   p = pp;
}